

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

ShaderResources * __thiscall
spirv_cross::Compiler::get_shader_resources
          (ShaderResources *__return_storage_ptr__,Compiler *this,
          unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
          *active_variables)

{
  ParsedIR *this_00;
  undefined8 uVar1;
  bool fallback_prefer_instance_name;
  bool bVar2;
  uint32_t uVar3;
  ExecutionModel EVar4;
  StorageClass SVar5;
  SPIRVariable *var;
  SPIRType *pSVar6;
  const_iterator cVar7;
  string *psVar8;
  int iVar9;
  TypedID<(spirv_cross::Types)0> *pTVar10;
  ShaderResources *this_01;
  string *this_02;
  uint32_t i;
  ulong uVar11;
  undefined1 local_128 [16];
  undefined1 auStack_118 [8];
  _Alloc_hider local_110;
  undefined1 local_108 [28];
  uint local_ec;
  ShaderResources *local_e8;
  ShaderResources *local_e0;
  ShaderResources *local_d8;
  ShaderResources *local_d0;
  SmallVector<spirv_cross::BuiltInResource,_8UL> *local_c8;
  LoopLock local_c0;
  ShaderResources *local_b8;
  ShaderResources *local_b0;
  ShaderResources *local_a8;
  ShaderResources *local_a0;
  ShaderResources *local_98;
  ShaderResources *local_90;
  ShaderResources *local_88;
  ShaderResources *local_80;
  ShaderResources *local_78;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_70;
  TypedID<(spirv_cross::Types)0> *local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_e8 = __return_storage_ptr__;
  ShaderResources::ShaderResources(__return_storage_ptr__);
  fallback_prefer_instance_name = reflection_ssbo_instance_name_is_significant(this);
  this_00 = &this->ir;
  local_70 = &active_variables->_M_h;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar10 = (this->ir).ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_68 = pTVar10 + (this->ir).ids_for_type[2].
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_d0 = (ShaderResources *)&local_e8->stage_outputs;
  local_78 = (ShaderResources *)&local_e8->subpass_inputs;
  local_d8 = (ShaderResources *)&local_e8->stage_inputs;
  local_98 = (ShaderResources *)&local_e8->storage_images;
  local_80 = (ShaderResources *)&local_e8->shader_record_buffers;
  local_88 = (ShaderResources *)&local_e8->push_constant_buffers;
  local_e0 = (ShaderResources *)&local_e8->storage_buffers;
  local_b8 = (ShaderResources *)&local_e8->acceleration_structures;
  local_b0 = (ShaderResources *)&local_e8->atomic_counters;
  local_a8 = (ShaderResources *)&local_e8->sampled_images;
  local_a0 = (ShaderResources *)&local_e8->separate_samplers;
  local_90 = (ShaderResources *)&local_e8->separate_images;
  do {
    if (pTVar10 == local_68) {
      ParsedIR::LoopLock::~LoopLock(&local_c0);
      return local_e8;
    }
    if ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[pTVar10->id].type == TypeVariable)
    {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,pTVar10->id);
      pSVar6 = get<spirv_cross::SPIRType>(this,*(uint32_t *)&(var->super_IVariant).field_0xc);
      if ((var->storage != StorageClassFunction) && (pSVar6->pointer == true)) {
        if (local_70 !=
            (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)0x0) {
          local_128._0_4_ = (var->super_IVariant).self.id;
          cVar7 = ::std::
                  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(local_70,(key_type *)local_128);
          if (cVar7.super__Node_iterator_base<spirv_cross::TypedID<(spirv_cross::Types)2>,_true>.
              _M_cur == (__node_type *)0x0) goto LAB_00371861;
        }
        uVar3 = ParsedIR::get_spirv_version(this_00);
        if (uVar3 < 0x10400) {
          if ((var->storage | StorageClassUniform) == StorageClassOutput) {
            bVar2 = interface_variable_exists_in_entry_point(this,(var->super_IVariant).self.id);
            goto LAB_00371205;
          }
        }
        else {
          bVar2 = interface_variable_exists_in_entry_point(this,(var->super_IVariant).self.id);
LAB_00371205:
          if (bVar2 == false) goto LAB_00371861;
        }
        bVar2 = is_builtin_variable(this,var);
        SVar5 = var->storage;
        uVar11 = (ulong)SVar5;
        if (bVar2) {
          if ((SVar5 | StorageClassUniform) != StorageClassOutput) goto LAB_00371861;
          local_c8 = &local_e8->builtin_outputs;
          if (SVar5 == StorageClassInput) {
            local_c8 = &local_e8->builtin_inputs;
          }
          local_128._4_4_ = 0;
          local_128._8_4_ = 0;
          local_128._12_4_ = 0;
          auStack_118._0_4_ = 0;
          local_110._M_p = local_108 + 8;
          local_108._0_8_ = 0;
          local_108[8] = '\0';
          bVar2 = ParsedIR::has_decoration
                            (this_00,(ID)(pSVar6->super_IVariant).self.id,DecorationBlock);
          if (bVar2) {
            local_60._0_4_ = (var->super_IVariant).self.id;
            local_60._4_4_ = *(uint32_t *)&(var->super_IVariant).field_0xc;
            local_60._8_4_ = (pSVar6->super_IVariant).self.id;
            get_remapped_declared_block_name_abi_cxx11_
                      ((string *)(local_60 + 0x10),this,local_60._0_4_,false);
            Resource::operator=((Resource *)(local_128 + 8),(Resource *)local_60);
            ::std::__cxx11::string::~string((string *)(local_60 + 0x10));
            for (uVar11 = 0;
                uVar11 < (uint)(pSVar6->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                               buffer_size; uVar11 = uVar11 + 1) {
              local_128._4_4_ =
                   (pSVar6->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar11].id;
              local_128._0_4_ =
                   ParsedIR::get_member_decoration
                             (this_00,(TypeID)(pSVar6->super_IVariant).self.id,(uint32_t)uVar11,
                              DecorationBuiltIn);
              SmallVector<spirv_cross::BuiltInResource,_8UL>::push_back
                        (local_c8,(BuiltInResource *)local_128);
            }
          }
          else {
            bVar2 = ParsedIR::has_decoration
                              (this_00,(ID)(var->super_IVariant).self.id,DecorationPatch);
            local_ec = (uint)CONCAT71((int7)(uVar11 >> 8),1);
            if (!bVar2) {
              EVar4 = get_execution_model(this);
              if (EVar4 == ExecutionModelTessellationControl) {
                local_ec = 0;
              }
              else {
                EVar4 = get_execution_model(this);
                if (EVar4 == ExecutionModelTessellationEvaluation) {
                  local_ec = (uint)(var->storage != StorageClassInput);
                }
              }
            }
            local_60._0_4_ = (var->super_IVariant).self.id;
            local_60._4_4_ = *(uint32_t *)&(var->super_IVariant).field_0xc;
            local_60._8_4_ = (pSVar6->super_IVariant).self.id;
            psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,local_60._0_4_);
            ::std::__cxx11::string::string((string *)(local_60 + 0x10),(string *)psVar8);
            Resource::operator=((Resource *)(local_128 + 8),(Resource *)local_60);
            ::std::__cxx11::string::~string((string *)(local_60 + 0x10));
            if ((char)local_ec == '\0' &&
                (pSVar6->array).super_VectorView<unsigned_int>.buffer_size != 0) {
              pSVar6 = get_variable_data_type(this,var);
              local_128._4_4_ = (pSVar6->parent_type).id;
            }
            else {
              local_128._4_4_ = get_variable_data_type_id(this,var);
            }
            if (local_128._4_4_ == 0) {
              __assert_fail("resource.value_type_id",
                            "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_cross.cpp"
                            ,0x3a5,
                            "auto spirv_cross::Compiler::get_shader_resources(const unordered_set<VariableID> *)::(anonymous class)::operator()(uint32_t, const SPIRVariable &) const"
                           );
            }
            local_128._0_4_ =
                 ParsedIR::get_decoration
                           (this_00,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
            SmallVector<spirv_cross::BuiltInResource,_8UL>::push_back
                      (local_c8,(BuiltInResource *)local_128);
          }
          this_02 = (string *)&local_110;
        }
        else {
          if (SVar5 == StorageClassUniformConstant) {
            if ((pSVar6->image).dim == DimSubpassData) {
              uVar1 = *(undefined8 *)&(var->super_IVariant).self;
              local_128._0_4_ = (undefined4)uVar1;
              local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
              local_128._8_4_ = (pSVar6->super_IVariant).self.id;
              psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_128._0_4_);
              ::std::__cxx11::string::string((string *)(local_128 + 0x10),(string *)psVar8);
              this_01 = local_78;
            }
            else {
LAB_00371438:
              SVar5 = pSVar6->storage;
              if (SVar5 == StorageClassUniform) {
                bVar2 = ParsedIR::has_decoration
                                  (this_00,(ID)(pSVar6->super_IVariant).self.id,DecorationBlock);
                if (bVar2) {
                  uVar1 = *(undefined8 *)&(var->super_IVariant).self;
                  local_128._0_4_ = (undefined4)uVar1;
                  local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                  local_128._8_4_ = (pSVar6->super_IVariant).self.id;
                  get_remapped_declared_block_name_abi_cxx11_
                            ((string *)(local_128 + 0x10),this,local_128._0_4_,false);
                  this_01 = local_e8;
                  goto LAB_00371847;
                }
                SVar5 = pSVar6->storage;
                if (SVar5 == StorageClassUniform) {
                  bVar2 = ParsedIR::has_decoration
                                    (this_00,(ID)(pSVar6->super_IVariant).self.id,
                                     DecorationBufferBlock);
                  if (bVar2) {
                    uVar1 = *(undefined8 *)&(var->super_IVariant).self;
                    local_128._0_4_ = (undefined4)uVar1;
                    local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                    local_128._8_4_ = (pSVar6->super_IVariant).self.id;
                    get_remapped_declared_block_name_abi_cxx11_
                              ((string *)(local_128 + 0x10),this,local_128._0_4_,
                               fallback_prefer_instance_name);
                    this_01 = local_e0;
                    goto LAB_00371847;
                  }
                  SVar5 = pSVar6->storage;
                }
              }
              if (SVar5 == StorageClassUniformConstant) {
                iVar9 = *(int *)&(pSVar6->super_IVariant).field_0xc;
                uVar3 = (pSVar6->image).sampled;
                if (uVar3 == 2 && iVar9 == 0x10) {
                  uVar1 = *(undefined8 *)&(var->super_IVariant).self;
                  local_128._0_4_ = (undefined4)uVar1;
                  local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                  local_128._8_4_ = (pSVar6->super_IVariant).self.id;
                  psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_128._0_4_);
                  ::std::__cxx11::string::string((string *)(local_128 + 0x10),(string *)psVar8);
                  this_01 = local_98;
                }
                else {
LAB_00371713:
                  if (((SVar5 == StorageClassUniformConstant) && (iVar9 == 0x10)) && (uVar3 == 1)) {
                    uVar1 = *(undefined8 *)&(var->super_IVariant).self;
                    local_128._0_4_ = (undefined4)uVar1;
                    local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                    local_128._8_4_ = (pSVar6->super_IVariant).self.id;
                    psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_128._0_4_);
                    ::std::__cxx11::string::string((string *)(local_128 + 0x10),(string *)psVar8);
                    this_01 = local_90;
                  }
                  else if (iVar9 == 0x12 && SVar5 == StorageClassUniformConstant) {
                    uVar1 = *(undefined8 *)&(var->super_IVariant).self;
                    local_128._0_4_ = (undefined4)uVar1;
                    local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                    local_128._8_4_ = (pSVar6->super_IVariant).self.id;
                    psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_128._0_4_);
                    ::std::__cxx11::string::string((string *)(local_128 + 0x10),(string *)psVar8);
                    this_01 = local_a0;
                  }
                  else {
                    if (iVar9 != 0x11 || SVar5 != StorageClassUniformConstant) {
                      if (SVar5 == StorageClassUniformConstant) {
                        if (iVar9 == 0x13) {
                          uVar1 = *(undefined8 *)&(var->super_IVariant).self;
                          local_128._0_4_ = (undefined4)uVar1;
                          local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                          local_128._8_4_ = (pSVar6->super_IVariant).self.id;
                          psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_128._0_4_);
                          ::std::__cxx11::string::string
                                    ((string *)(local_128 + 0x10),(string *)psVar8);
                          this_01 = local_b8;
                          goto LAB_00371847;
                        }
                      }
                      else if (SVar5 == StorageClassAtomicCounter) {
                        uVar1 = *(undefined8 *)&(var->super_IVariant).self;
                        local_128._0_4_ = (undefined4)uVar1;
                        local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                        local_128._8_4_ = (pSVar6->super_IVariant).self.id;
                        psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_128._0_4_);
                        ::std::__cxx11::string::string
                                  ((string *)(local_128 + 0x10),(string *)psVar8);
                        this_01 = local_b0;
                        goto LAB_00371847;
                      }
                      goto LAB_00371861;
                    }
                    uVar1 = *(undefined8 *)&(var->super_IVariant).self;
                    local_128._0_4_ = (undefined4)uVar1;
                    local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                    local_128._8_4_ = (pSVar6->super_IVariant).self.id;
                    psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_128._0_4_);
                    ::std::__cxx11::string::string((string *)(local_128 + 0x10),(string *)psVar8);
                    this_01 = local_a8;
                  }
                }
              }
              else if (SVar5 == StorageClassPushConstant) {
                uVar1 = *(undefined8 *)&(var->super_IVariant).self;
                local_128._0_4_ = (undefined4)uVar1;
                local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                local_128._8_4_ = (pSVar6->super_IVariant).self.id;
                psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_128._0_4_);
                ::std::__cxx11::string::string((string *)(local_128 + 0x10),(string *)psVar8);
                this_01 = local_88;
              }
              else if (SVar5 == StorageClassStorageBuffer) {
                uVar1 = *(undefined8 *)&(var->super_IVariant).self;
                local_128._0_4_ = (undefined4)uVar1;
                local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                local_128._8_4_ = (pSVar6->super_IVariant).self.id;
                get_remapped_declared_block_name_abi_cxx11_
                          ((string *)(local_128 + 0x10),this,local_128._0_4_,
                           fallback_prefer_instance_name);
                this_01 = local_e0;
              }
              else {
                if (SVar5 != StorageClassShaderRecordBufferKHR) {
                  iVar9 = *(int *)&(pSVar6->super_IVariant).field_0xc;
                  uVar3 = (pSVar6->image).sampled;
                  goto LAB_00371713;
                }
                uVar1 = *(undefined8 *)&(var->super_IVariant).self;
                local_128._0_4_ = (undefined4)uVar1;
                local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                local_128._8_4_ = (pSVar6->super_IVariant).self.id;
                get_remapped_declared_block_name_abi_cxx11_
                          ((string *)(local_128 + 0x10),this,local_128._0_4_,
                           fallback_prefer_instance_name);
                this_01 = local_80;
              }
            }
          }
          else if (SVar5 == StorageClassOutput) {
            bVar2 = ParsedIR::has_decoration
                              (this_00,(ID)(pSVar6->super_IVariant).self.id,DecorationBlock);
            if (bVar2) {
              uVar1 = *(undefined8 *)&(var->super_IVariant).self;
              local_128._0_4_ = (undefined4)uVar1;
              local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
              local_128._8_4_ = (pSVar6->super_IVariant).self.id;
              get_remapped_declared_block_name_abi_cxx11_
                        ((string *)(local_128 + 0x10),this,local_128._0_4_,false);
              this_01 = local_d0;
            }
            else {
              uVar1 = *(undefined8 *)&(var->super_IVariant).self;
              local_128._0_4_ = (undefined4)uVar1;
              local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
              local_128._8_4_ = (pSVar6->super_IVariant).self.id;
              psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_128._0_4_);
              ::std::__cxx11::string::string((string *)(local_128 + 0x10),(string *)psVar8);
              this_01 = local_d0;
            }
          }
          else {
            if (SVar5 != StorageClassInput) goto LAB_00371438;
            bVar2 = ParsedIR::has_decoration
                              (this_00,(ID)(pSVar6->super_IVariant).self.id,DecorationBlock);
            if (bVar2) {
              uVar1 = *(undefined8 *)&(var->super_IVariant).self;
              local_128._0_4_ = (undefined4)uVar1;
              local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
              local_128._8_4_ = (pSVar6->super_IVariant).self.id;
              get_remapped_declared_block_name_abi_cxx11_
                        ((string *)(local_128 + 0x10),this,local_128._0_4_,false);
              this_01 = local_d8;
            }
            else {
              uVar1 = *(undefined8 *)&(var->super_IVariant).self;
              local_128._0_4_ = (undefined4)uVar1;
              local_128._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
              local_128._8_4_ = (pSVar6->super_IVariant).self.id;
              psVar8 = ParsedIR::get_name_abi_cxx11_(this_00,(ID)local_128._0_4_);
              ::std::__cxx11::string::string((string *)(local_128 + 0x10),(string *)psVar8);
              this_01 = local_d8;
            }
          }
LAB_00371847:
          SmallVector<spirv_cross::Resource,_8UL>::push_back
                    (&this_01->uniform_buffers,(Resource *)local_128);
          this_02 = (string *)(local_128 + 0x10);
        }
        ::std::__cxx11::string::~string(this_02);
      }
    }
LAB_00371861:
    pTVar10 = pTVar10 + 1;
  } while( true );
}

Assistant:

ShaderResources Compiler::get_shader_resources(const unordered_set<VariableID> *active_variables) const
{
	ShaderResources res;

	bool ssbo_instance_name = reflection_ssbo_instance_name_is_significant();

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// It is possible for uniform storage classes to be passed as function parameters, so detect
		// that. To detect function parameters, check of StorageClass of variable is function scope.
		if (var.storage == StorageClassFunction || !type.pointer)
			return;

		if (active_variables && active_variables->find(var.self) == end(*active_variables))
			return;

		// In SPIR-V 1.4 and up, every global must be present in the entry point interface list,
		// not just IO variables.
		bool active_in_entry_point = true;
		if (ir.get_spirv_version() < 0x10400)
		{
			if (var.storage == StorageClassInput || var.storage == StorageClassOutput)
				active_in_entry_point = interface_variable_exists_in_entry_point(var.self);
		}
		else
			active_in_entry_point = interface_variable_exists_in_entry_point(var.self);

		if (!active_in_entry_point)
			return;

		bool is_builtin = is_builtin_variable(var);

		if (is_builtin)
		{
			if (var.storage != StorageClassInput && var.storage != StorageClassOutput)
				return;

			auto &list = var.storage == StorageClassInput ? res.builtin_inputs : res.builtin_outputs;
			BuiltInResource resource;

			if (has_decoration(type.self, DecorationBlock))
			{
				resource.resource = { var.self, var.basetype, type.self,
				                      get_remapped_declared_block_name(var.self, false) };

				for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
				{
					resource.value_type_id = type.member_types[i];
					resource.builtin = BuiltIn(get_member_decoration(type.self, i, DecorationBuiltIn));
					list.push_back(resource);
				}
			}
			else
			{
				bool strip_array =
						!has_decoration(var.self, DecorationPatch) && (
								get_execution_model() == ExecutionModelTessellationControl ||
								(get_execution_model() == ExecutionModelTessellationEvaluation &&
								 var.storage == StorageClassInput));

				resource.resource = { var.self, var.basetype, type.self, get_name(var.self) };

				if (strip_array && !type.array.empty())
					resource.value_type_id = get_variable_data_type(var).parent_type;
				else
					resource.value_type_id = get_variable_data_type_id(var);

				assert(resource.value_type_id);

				resource.builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
				list.push_back(std::move(resource));
			}
			return;
		}

		// Input
		if (var.storage == StorageClassInput)
		{
			if (has_decoration(type.self, DecorationBlock))
			{
				res.stage_inputs.push_back(
						{ var.self, var.basetype, type.self,
						  get_remapped_declared_block_name(var.self, false) });
			}
			else
				res.stage_inputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Subpass inputs
		else if (var.storage == StorageClassUniformConstant && type.image.dim == DimSubpassData)
		{
			res.subpass_inputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Outputs
		else if (var.storage == StorageClassOutput)
		{
			if (has_decoration(type.self, DecorationBlock))
			{
				res.stage_outputs.push_back(
						{ var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
			}
			else
				res.stage_outputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// UBOs
		else if (type.storage == StorageClassUniform && has_decoration(type.self, DecorationBlock))
		{
			res.uniform_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
		}
		// Old way to declare SSBOs.
		else if (type.storage == StorageClassUniform && has_decoration(type.self, DecorationBufferBlock))
		{
			res.storage_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Modern way to declare SSBOs.
		else if (type.storage == StorageClassStorageBuffer)
		{
			res.storage_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Push constant blocks
		else if (type.storage == StorageClassPushConstant)
		{
			// There can only be one push constant block, but keep the vector in case this restriction is lifted
			// in the future.
			res.push_constant_buffers.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		else if (type.storage == StorageClassShaderRecordBufferKHR)
		{
			res.shader_record_buffers.push_back({ var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Images
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Image &&
		         type.image.sampled == 2)
		{
			res.storage_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Separate images
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Image &&
		         type.image.sampled == 1)
		{
			res.separate_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Separate samplers
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Sampler)
		{
			res.separate_samplers.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Textures
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::SampledImage)
		{
			res.sampled_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Atomic counters
		else if (type.storage == StorageClassAtomicCounter)
		{
			res.atomic_counters.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Acceleration structures
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::AccelerationStructure)
		{
			res.acceleration_structures.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
	});

	return res;
}